

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O3

void __thiscall
tchecker::system::edges_t::add_edge
          (edges_t *this,process_id_t pid,loc_id_t src,loc_id_t tgt,event_id_t event_id,
          attributes_t *attributes)

{
  pointer psVar1;
  size_t sVar2;
  undefined4 uVar3;
  bool bVar4;
  edge_t *__p;
  runtime_error *this_00;
  edge_id_t id;
  edge_shared_ptr_t edge;
  __alloc_node_gen_t __alloc_node_gen;
  value_type local_48;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>_>_>
  local_38;
  
  id = (edge_id_t)
       ((ulong)((long)(this->_edges).
                      super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_edges).
                     super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  bVar4 = valid_edge_id(id);
  if (!bVar4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"add_edge: invalid edge identifier");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p = (edge_t *)operator_new(0x50);
  __p->_pid = pid;
  __p->_id = id;
  __p->_src = src;
  __p->_tgt = tgt;
  __p->_event_id = event_id;
  local_38._M_h = (__hashtable_alloc *)&__p->_attributes;
  (__p->_attributes)._map._M_h._M_buckets = (__buckets_ptr)0x0;
  (__p->_attributes)._map._M_h._M_bucket_count = (attributes->_map)._M_h._M_bucket_count;
  (__p->_attributes)._map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->_attributes)._map._M_h._M_element_count = (attributes->_map)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(attributes->_map)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (attributes->_map)._M_h._M_rehash_policy._M_next_resize;
  (__p->_attributes)._map._M_h._M_rehash_policy._M_max_load_factor =
       (attributes->_map)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__p->_attributes)._map._M_h._M_rehash_policy.field_0x4 = uVar3;
  (__p->_attributes)._map._M_h._M_rehash_policy._M_next_resize = sVar2;
  (__p->_attributes)._map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)local_38._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)attributes,&local_38);
  local_48.super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::system::edge_t*>
            (&local_48.super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  std::
  vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
  ::push_back(&this->_edges,&local_48);
  psVar1 = (this->_edges).
           super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)psVar1 -
       (long)(this->_edges).
             super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U ==
      (ulong)(psVar1[-1].super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_id) {
    loc_edges_maps_t::add_edge
              ((((this->_loc_edges_maps).
                 super__Vector_base<std::shared_ptr<tchecker::system::loc_edges_maps_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_edges_maps_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,tgt,&local_48);
    loc_edges_maps_t::add_edge
              ((this->_loc_edges_maps).
               super__Vector_base<std::shared_ptr<tchecker::system::loc_edges_maps_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_edges_maps_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,src,&local_48);
    proc_edges_maps_t::add_edge(&this->_proc_edges_map,pid,&local_48);
    if (local_48.super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  __assert_fail("_edges.back()->id() == _edges.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/edge.cc"
                ,0xcc,
                "void tchecker::system::edges_t::add_edge(tchecker::process_id_t, tchecker::loc_id_t, tchecker::loc_id_t, tchecker::event_id_t, const tchecker::system::attributes_t &)"
               );
}

Assistant:

void edges_t::add_edge(tchecker::process_id_t pid, tchecker::loc_id_t src, tchecker::loc_id_t tgt,
                       tchecker::event_id_t event_id, tchecker::system::attributes_t const & attributes)
{
  tchecker::edge_id_t id = _edges.size();

  if (!tchecker::valid_edge_id(id))
    throw std::runtime_error("add_edge: invalid edge identifier");

  tchecker::system::edge_shared_ptr_t edge(new tchecker::system::edge_t(pid, id, src, tgt, event_id, attributes));
  _edges.push_back(edge);
  assert(_edges.back()->id() == _edges.size() - 1);

  _loc_edges_maps[tchecker::system::INCOMING_EDGE]->add_edge(tgt, edge);
  _loc_edges_maps[tchecker::system::OUTGOING_EDGE]->add_edge(src, edge);

  _proc_edges_map.add_edge(pid, edge);
}